

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mbedtls_mpi_swap(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  size_t sVar1;
  mbedtls_mpi_uint *pmVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  mbedtls_mpi T;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  iVar4 = X->s;
  uVar5 = *(undefined4 *)&X->field_0x4;
  sVar1 = X->n;
  pmVar2 = X->p;
  uVar3 = *(undefined4 *)&Y->field_0x4;
  X->s = Y->s;
  *(undefined4 *)&X->field_0x4 = uVar3;
  X->n = Y->n;
  X->p = Y->p;
  Y->s = iVar4;
  *(undefined4 *)&Y->field_0x4 = uVar5;
  Y->n = sVar1;
  Y->p = pmVar2;
  return;
}

Assistant:

void mbedtls_mpi_swap( mbedtls_mpi *X, mbedtls_mpi *Y )
{
    mbedtls_mpi T;
    MPI_VALIDATE( X != NULL );
    MPI_VALIDATE( Y != NULL );

    memcpy( &T,  X, sizeof( mbedtls_mpi ) );
    memcpy(  X,  Y, sizeof( mbedtls_mpi ) );
    memcpy(  Y, &T, sizeof( mbedtls_mpi ) );
}